

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int __thiscall
CVmObjDate::getp_findWeekday(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  uint uVar3;
  int32_t dayno;
  vm_obj_id_t vVar4;
  CVmTimeZone *tz;
  uint argc;
  undefined4 in_register_00000034;
  int32_t daytime;
  int32_t local_40;
  caldate_t cd;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_findWeekday(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_findWeekday(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_findWeekday::desc.min_argc_ = 2;
      getp_findWeekday::desc.opt_argc_ = 1;
      getp_findWeekday::desc.varargs_ = 0;
      __cxa_guard_release(&getp_findWeekday(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_findWeekday::desc);
  if (iVar1 == 0) {
    iVar2 = vm_val_t::num_to_int(sp_ + -1);
    uVar3 = vm_val_t::num_to_int(sp_ + -2);
    if ((iVar2 - 8U < 0xfffffff9) || (uVar3 == 0)) {
      err_throw(0x902);
    }
    tz = get_tz_arg(2,argc);
    dayno = get_local_date(this,tz);
    caldate_t::set_dayno(&cd,dayno);
    iVar1 = caldate_t::weekday(&cd);
    iVar1 = ((iVar2 - iVar1) + 6) % 7;
    if ((int)uVar3 < 1) {
      local_40 = iVar1 + -7;
      if (6 < iVar1 - 1U) {
        local_40 = iVar1;
      }
      local_40 = ~uVar3 * -7 + local_40;
    }
    else {
      local_40 = uVar3 * 7 + iVar1 + -7;
    }
    local_40 = local_40 + dayno;
    daytime = 0;
    CVmTimeZone::local_to_utc(tz,&local_40,&daytime);
    vVar4 = create(0,local_40,daytime);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar4;
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_findWeekday(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the day of week and 'which' arguments */
    int32_t wday = G_stk->get(0)->num_to_int(vmg0_);
    int32_t which = G_stk->get(1)->num_to_int(vmg0_);

    /* check the weekday and 'which' ranges */
    if (wday < 1 || wday > 7 || which == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* adjust wday to 0=Sunday */
    wday -= 1;

    /* get my date in local time */
    CVmTimeZone *tz = get_tz_arg(vmg_ 2, argc);
    int32_t dayno = get_local_date(tz);

    /* figure my weekday */
    caldate_t cd(dayno);
    int my_wday = cd.weekday();

    /* figure the difference between the target day and my day, mod 7 */
    int delta = (7 + wday - my_wday) % 7;

    /* 
     *   Go forward that many days, or backwards (7 - delta), to get the
     *   first occurrence before/after my date.  Then go forwards or
     *   backwards by additional weeks as needed.
     */
    if (which > 0)
        dayno += delta + (which-1)*7;
    else
        dayno -= ((7 - delta) % 7) + (-which-1)*7;

    /* return a new date at midnight on the given day */
    int32_t daytime = 0;
    tz->local_to_utc(dayno, daytime);
    retval->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}